

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

void duckdb_brotli::BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command *commands,
               size_t *num_commands,size_t *num_literals)

{
  anon_union_7040_2_2186ba77_for_ZopfliCostModel_6 *histogram;
  uint32_t *histogram_00;
  float *cost;
  BackwardMatch *src2;
  ulong *data;
  long lVar1;
  uint32_t *puVar2;
  int *piVar3;
  ushort uVar4;
  ushort uVar5;
  size_t sVar6;
  BrotliEncoderDictionary *dictionary;
  uint32_t *puVar7;
  size_t sVar8;
  PreparedDictionary *pPVar9;
  float *pfVar10;
  byte bVar11;
  ulong uVar12;
  undefined1 uVar13;
  anon_union_4_3_cc401a1e_for_u *paVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ZopfliCostModel *self;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  size_t sVar23;
  BackwardMatch *src1;
  undefined8 *puVar24;
  long lVar25;
  ZopfliNode *nodes;
  size_t sVar26;
  ulong uVar27;
  size_t sVar28;
  ulong *puVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  uint8_t *puVar35;
  ulong uVar36;
  size_t sVar37;
  ulong uVar38;
  ulong uVar39;
  size_t gap;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  uint8_t *puVar43;
  ulong uVar44;
  uint *puVar45;
  uint8_t *puVar46;
  long lVar47;
  uint8_t *puVar48;
  ulong *puVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  size_t sVar53;
  ulong uVar54;
  BackwardMatch *pBVar55;
  ulong *puVar56;
  bool bVar57;
  bool bVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  ulong local_288;
  ulong local_278;
  ulong local_270;
  size_t total_found;
  long local_260;
  ulong local_258;
  size_t max_backward;
  void *local_238;
  long local_218;
  long local_210;
  void *local_1f0;
  ulong local_1d0;
  int orig_dist_cache [4];
  StartPosQueue local_138;
  
  iVar18 = params->lgwin;
  if (num_bytes == 0) {
    self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
    gap = (params->dictionary).compound.total_size;
    bVar57 = false;
    local_1f0 = (void *)0x0;
    local_238 = (void *)0x0;
  }
  else {
    sVar6 = params->stream_offset;
    local_1d0 = num_bytes * 4;
    local_1f0 = BrotliAllocate(m,local_1d0);
    local_238 = (void *)0x0;
    lVar42 = num_bytes - 0x7f;
    if (num_bytes < 0x7f) {
      lVar42 = 0;
    }
    self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
    if (local_1d0 != 0) {
      local_238 = BrotliAllocate(m,num_bytes << 5);
    }
    gap = (params->dictionary).compound.total_size;
    bVar57 = 3 < num_bytes;
    if (bVar57) {
      uVar40 = (1L << ((byte)iVar18 & 0x3f)) - 0x10;
      uVar27 = (ulong)((params->dictionary).compound.num_chunks != 0) * 0x100;
      local_218 = 0;
      lVar25 = 0;
      auVar64 = _DAT_003b4370;
LAB_002e802d:
      uVar32 = lVar25 + position;
      uVar38 = uVar40;
      if (uVar32 < uVar40) {
        uVar38 = uVar32;
      }
      uVar50 = uVar32 + sVar6;
      if (uVar40 <= uVar50) {
        uVar50 = uVar40;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        uVar22 = 0;
      }
      else {
        if (uVar32 == 0) {
          bVar15 = 0;
LAB_002e80a5:
          uVar22 = 0;
        }
        else {
          bVar15 = ringbuffer[uVar32 - 1 & ringbuffer_mask];
          if (uVar32 == 1) goto LAB_002e80a5;
          uVar22 = (ulong)ringbuffer[uVar32 - 2 & ringbuffer_mask];
        }
        uVar22 = (ulong)(params->dictionary).contextual.context_map
                        [literal_context_lut[uVar22 + 0x100] | literal_context_lut[bVar15]];
      }
      uVar20 = (uVar27 | 0x80) + local_218;
      if (local_1d0 < uVar20) {
        uVar33 = local_1d0;
        if (local_1d0 == 0) {
          uVar33 = uVar20;
        }
        do {
          uVar44 = uVar33;
          uVar33 = uVar44 * 2;
        } while (uVar44 < uVar20);
        pvVar21 = BrotliAllocate(m,uVar44 * 8);
        if (local_1d0 != 0) {
          switchD_00332694::default(pvVar21,local_238,local_1d0 << 3);
        }
        BrotliFree(m,local_238);
        local_238 = pvVar21;
        auVar64 = _DAT_003b4370;
        local_1d0 = uVar44;
      }
      uVar33 = num_bytes - lVar25;
      dictionary = (params->dictionary).contextual.dict[uVar22];
      lVar34 = local_218 + uVar27;
      src2 = (BackwardMatch *)((long)local_238 + lVar34 * 8);
      uVar20 = uVar32 & ringbuffer_mask;
      uVar22 = 0x10;
      if (params->quality == 0xb) {
        uVar22 = 0x40;
      }
      uVar44 = 0;
      if (uVar22 <= uVar32) {
        uVar44 = uVar32 - uVar22;
      }
      uVar22 = uVar32 - 1;
      uVar41 = 1;
      total_found = (size_t)src2;
      if (uVar44 < uVar22) {
        puVar35 = ringbuffer + uVar20;
LAB_002e824d:
        if (uVar32 - uVar22 <= uVar38) {
          if ((*puVar35 == ringbuffer[uVar22 & ringbuffer_mask]) &&
             (puVar43 = ringbuffer + (uVar22 & ringbuffer_mask), puVar35[1] == puVar43[1])) {
            puVar46 = puVar43;
            puVar48 = puVar35;
            uVar51 = uVar33;
            if (7 < uVar33) {
              lVar47 = 0;
LAB_002e829a:
              if (*(ulong *)(puVar35 + lVar47) == *(ulong *)(puVar43 + lVar47))
              goto code_r0x002e82a7;
              uVar39 = *(ulong *)(puVar43 + lVar47) ^ *(ulong *)(puVar35 + lVar47);
              uVar51 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
              uVar51 = (uVar51 >> 3 & 0x1fffffff) + lVar47;
              goto LAB_002e8318;
            }
            goto LAB_002e82c1;
          }
          goto LAB_002e8339;
        }
      }
LAB_002e834b:
      if (uVar41 < uVar33) {
        uVar17 = (uint)(*(int *)(ringbuffer + uVar20) * 0x1e35a7bd) >> 0xf;
        uVar22 = (hasher->privat)._H5.bucket_size_;
        puVar7 = (hasher->privat)._H2.buckets_;
        pvVar21 = (hasher->privat)._H40.extra[1];
        uVar51 = (ulong)puVar7[uVar17];
        uVar44 = uVar33;
        if (0x7f < uVar33) {
          puVar7[uVar17] = (uint32_t)uVar32;
          uVar44 = 0x80;
        }
        local_210 = (uVar22 & uVar32) * 2 + 1;
        local_260 = (uVar22 & uVar32) * 2;
        if (uVar32 != uVar51) {
          lVar47 = 0x40;
          local_270 = 0;
          uVar39 = 0;
LAB_002e8447:
          bVar58 = lVar47 != 0;
          lVar47 = lVar47 + -1;
          if ((uVar32 - uVar51 <= uVar38) && (bVar58)) {
            uVar31 = local_270;
            if (uVar39 < local_270) {
              uVar31 = uVar39;
            }
            puVar35 = ringbuffer + uVar31 + uVar20;
            puVar43 = ringbuffer + uVar31 + (uVar51 & ringbuffer_mask);
            uVar54 = uVar33 - uVar31;
            puVar46 = puVar35;
            if (7 < uVar54) {
              lVar52 = 0;
LAB_002e849f:
              if (*(ulong *)(puVar43 + lVar52) == *(ulong *)(puVar35 + lVar52))
              goto code_r0x002e84ac;
              uVar36 = *(ulong *)(puVar35 + lVar52) ^ *(ulong *)(puVar43 + lVar52);
              uVar54 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              lVar52 = (uVar54 >> 3 & 0x1fffffff) + lVar52;
              goto LAB_002e852c;
            }
            goto LAB_002e84d0;
          }
        }
LAB_002e83d0:
        if (0x7f < uVar33) {
          iVar18 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)pvVar21 + local_260 * 4) = iVar18;
LAB_002e83fd:
          *(int *)((long)pvVar21 + local_210 * 4) = iVar18;
        }
      }
LAB_002e8616:
      lVar47 = 3;
      auVar61 = _DAT_003b4360;
      auVar62 = _DAT_003b4350;
      do {
        if (SUB164(auVar61 ^ auVar64,4) == -0x80000000 && SUB164(auVar61 ^ auVar64,0) < -0x7fffffda)
        {
          orig_dist_cache[lVar47 + 1] = 0xfffffff;
          orig_dist_cache[lVar47 + 2] = 0xfffffff;
        }
        if (SUB164(auVar62 ^ auVar64,4) == -0x80000000 && SUB164(auVar62 ^ auVar64,0) < -0x7fffffda)
        {
          orig_dist_cache[lVar47 + 3] = 0xfffffff;
          local_138.q_[0].distance_cache[lVar47 + -2] = 0xfffffff;
        }
        lVar52 = auVar61._8_8_;
        auVar61._0_8_ = auVar61._0_8_ + 4;
        auVar61._8_8_ = lVar52 + 4;
        lVar52 = auVar62._8_8_;
        auVar62._0_8_ = auVar62._0_8_ + 4;
        auVar62._8_8_ = lVar52 + 4;
        lVar47 = lVar47 + 4;
      } while (lVar47 != 0x2b);
      uVar41 = uVar41 + 1;
      if (uVar41 < 5) {
        uVar41 = 4;
      }
      data = (ulong *)(ringbuffer + uVar20);
      iVar18 = BrotliFindAllStaticDictionaryMatches
                         (dictionary,(uint8_t *)data,uVar41,uVar33,(uint32_t *)&local_138);
      auVar64 = _DAT_003b4370;
      if (iVar18 != 0) {
        uVar38 = 0x25;
        if (uVar33 < 0x25) {
          uVar38 = uVar33;
        }
        if (uVar41 <= uVar38) {
          iVar18 = (int)uVar41 << 5;
          do {
            uVar17 = local_138.q_[0].distance_cache[uVar41 - 2];
            if ((uVar17 < 0xfffffff) &&
               (uVar22 = (ulong)(uVar17 >> 5) + gap + 1 + uVar50,
               uVar22 <= (params->dist).max_distance)) {
              uVar17 = uVar17 & 0x1f;
              *(int *)total_found = (int)uVar22;
              if (uVar41 == uVar17) {
                uVar17 = 0;
              }
              *(uint *)(total_found + 4) = uVar17 + iVar18;
              total_found = total_found + 8;
            }
            uVar41 = uVar41 + 1;
            iVar18 = iVar18 + 0x20;
          } while (uVar38 + 1 != uVar41);
        }
      }
      sVar23 = (long)(total_found - (long)src2) >> 3;
      sVar8 = (params->dictionary).compound.num_chunks;
      if (sVar8 != 0) {
        uVar38 = (params->dist).max_distance;
        src1 = (BackwardMatch *)((long)local_238 + lVar34 * 8 + -0x200);
        sVar28 = (params->dictionary).compound.total_size;
        uVar22 = *data;
        local_258 = 3;
        sVar37 = 0;
        sVar53 = 0;
LAB_002e8855:
        pPVar9 = (params->dictionary).compound.chunks[sVar53];
        bVar15 = (byte)pPVar9->bucket_bits;
        bVar16 = (byte)pPVar9->slot_bits;
        bVar11 = -(char)pPVar9->hash_bits;
        uVar44 = ((uVar22 << (bVar11 & 0x3f)) >> (bVar11 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                 (-bVar15 & 0x3f);
        lVar47 = (1L << (bVar16 & 0x3f)) * 4;
        lVar52 = (1L << (bVar15 & 0x3f)) * 2;
        bVar16 = -bVar16;
        uVar17 = (uint)*(ushort *)((long)&pPVar9[1].magic + (uVar44 & 0xffffffff) * 2 + lVar47);
        puVar24 = (undefined8 *)
                  ((long)&pPVar9[1].magic + (ulong)pPVar9->num_items * 4 + lVar52 + lVar47);
        if (pPVar9->magic != 0xdebcede0) {
          puVar24 = (undefined8 *)*puVar24;
        }
        sVar26 = (params->dictionary).compound.chunk_offsets[sVar53];
        pBVar55 = src1 + sVar37;
        uVar19 = pPVar9->source_size;
        puVar45 = (uint *)((long)&pPVar9[1].magic +
                          (ulong)(uVar17 + (&pPVar9[1].magic)
                                           [(uint)((int)uVar44 << (bVar16 & 0x1f)) >>
                                            (bVar16 & 0x1f)]) * 4 + lVar52 + lVar47);
        uVar17 = (uint)(uVar17 == 0xffff);
        lVar47 = 0;
        uVar44 = local_258;
LAB_002e893b:
        if (uVar17 == 0) {
LAB_002e8960:
          uVar17 = *puVar45;
          puVar45 = puVar45 + 1;
          uVar51 = (ulong)(uVar17 & 0x7fffffff);
          uVar17 = uVar17 & 0x80000000;
          uVar39 = ((uVar50 + sVar28) - sVar26) - uVar51;
          uVar41 = uVar19 - uVar51;
          if (uVar33 <= uVar41) {
            uVar41 = uVar33;
          }
          if ((((uVar39 <= uVar38) && (uVar20 + uVar44 <= ringbuffer_mask)) && (uVar44 < uVar41)) &&
             (ringbuffer[uVar20 + uVar44] == *(uint8_t *)((long)puVar24 + uVar44 + uVar51))) {
            puVar49 = (ulong *)(uVar51 + (long)puVar24);
            puVar29 = puVar49;
            puVar56 = data;
            if (7 < uVar41) {
              lVar52 = 0;
              puVar30 = puVar49;
LAB_002e89fb:
              if (*puVar56 == *puVar30) goto code_r0x002e8a07;
              uVar51 = *puVar30 ^ *puVar56;
              uVar41 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = (uVar41 >> 3 & 0x1fffffff) - lVar52;
              goto LAB_002e8a64;
            }
            goto LAB_002e8a30;
          }
          goto LAB_002e8a7d;
        }
        goto LAB_002e8ad4;
      }
      goto LAB_002e8b7e;
    }
    bVar57 = false;
  }
LAB_002e91d1:
  sVar6 = *num_literals;
  sVar8 = *last_insert_len;
  orig_dist_cache._0_8_ = *(undefined8 *)dist_cache;
  orig_dist_cache._8_8_ = *(undefined8 *)(dist_cache + 2);
  sVar23 = *num_commands;
  lVar42 = num_bytes + 1;
  if (lVar42 == 0) {
    nodes = (ZopfliNode *)0x0;
  }
  else {
    nodes = (ZopfliNode *)BrotliAllocate(m,lVar42 * 0x10);
  }
  InitZopfliCostModel(m,self,&params->dist,num_bytes);
  histogram = &self->field_6;
  puVar7 = (self->field_6).arena.histogram_cmd;
  histogram_00 = (self->field_6).arena.histogram_dist;
  cost = (self->field_6).arena.cost_literal;
  uVar13 = true;
  lVar25 = lVar42;
  paVar14 = &nodes->u;
  do {
    for (; lVar25 != 0; lVar25 = lVar25 + -1) {
      ((ZopfliNode *)(paVar14 + -3))->length = 1;
      ((ZopfliNode *)(paVar14 + -3))->distance = 0;
      *(undefined8 *)(paVar14 + -1) = 0x7effc99e00000000;
      paVar14 = paVar14 + 4;
    }
    if ((bool)uVar13) {
      ZopfliCostModelSetFromLiteralCosts(self,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar28 = *num_commands;
      memset(histogram,0,0x1780);
      if (sVar28 != sVar23) {
        lVar25 = 0;
        uVar40 = position - sVar8;
        do {
          uVar38 = (ulong)commands[lVar25].insert_len_;
          uVar17 = commands[lVar25].copy_len_;
          uVar4 = commands[lVar25].dist_prefix_;
          uVar5 = commands[lVar25].cmd_prefix_;
          puVar2 = puVar7 + uVar5;
          *puVar2 = *puVar2 + 1;
          uVar27 = uVar40;
          uVar32 = uVar38;
          if (0x7f < uVar5) {
            puVar2 = histogram_00 + (uVar4 & 0x3ff);
            *puVar2 = *puVar2 + 1;
          }
          for (; uVar32 != 0; uVar32 = uVar32 - 1) {
            piVar3 = (int *)((long)histogram + (ulong)ringbuffer[uVar27 & ringbuffer_mask] * 4);
            *piVar3 = *piVar3 + 1;
            uVar27 = uVar27 + 1;
          }
          uVar40 = uVar40 + uVar38 + (ulong)(uVar17 & 0x1ffffff);
          lVar25 = lVar25 + 1;
        } while (lVar25 != sVar28 - sVar23);
      }
      SetCost((uint32_t *)histogram->literal_histograms,0x100,1,cost);
      SetCost(puVar7,0x2c0,0,self->cost_cmd_);
      SetCost(histogram_00,(ulong)self->distance_histogram_size,0,self->cost_dist_);
      fVar59 = 1.7e+38;
      lVar25 = 0;
      do {
        if (self->cost_cmd_[lVar25] <= fVar59) {
          fVar59 = self->cost_cmd_[lVar25];
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x2c0);
      self->min_cost_cmd_ = fVar59;
      pfVar10 = self->literal_costs_;
      sVar28 = self->num_bytes_;
      *pfVar10 = 0.0;
      if (sVar28 != 0) {
        fVar60 = 0.0;
        sVar37 = 0;
        fVar59 = 0.0;
        do {
          fVar60 = fVar60 + cost[ringbuffer[position + sVar37 & ringbuffer_mask]];
          fVar63 = fVar59 + fVar60;
          pfVar10[sVar37 + 1] = fVar63;
          sVar37 = sVar37 + 1;
          fVar60 = fVar60 - (fVar63 - fVar59);
          fVar59 = fVar63;
        } while (sVar28 != sVar37);
      }
    }
    *num_commands = sVar23;
    *num_literals = sVar6;
    *last_insert_len = sVar8;
    *(undefined8 *)dist_cache = orig_dist_cache._0_8_;
    *(undefined8 *)(dist_cache + 2) = orig_dist_cache._8_8_;
    iVar18 = params->lgwin;
    sVar28 = params->stream_offset;
    uVar17 = 0x145;
    if (params->quality < 0xb) {
      uVar17 = 0x96;
    }
    nodes->length = 0;
    (nodes->u).cost = 0.0;
    local_138.idx_ = 0;
    if (bVar57) {
      sVar53 = (1L << ((byte)iVar18 & 0x3f)) - 0x10;
      lVar25 = 0;
      sVar37 = 0;
      do {
        sVar26 = UpdateNodes(num_bytes,position,sVar37,ringbuffer,ringbuffer_mask,params,sVar53,
                             dist_cache,(ulong)*(uint *)((long)local_1f0 + sVar37 * 4),
                             (BackwardMatch *)((long)local_238 + lVar25 * 8),self,&local_138,nodes);
        uVar40 = 0;
        if (0x3fff < sVar26) {
          uVar40 = sVar26;
        }
        uVar27 = (ulong)*(uint *)((long)local_1f0 + sVar37 * 4);
        lVar25 = lVar25 + uVar27;
        if (((uVar27 == 1) &&
            (uVar19 = *(uint *)((long)local_238 + lVar25 * 8 + -4) >> 5, uVar17 < uVar19)) &&
           (uVar40 < uVar19)) {
          uVar40 = (ulong)uVar19;
        }
        if (1 < uVar40) {
          lVar34 = uVar40 - 1;
          uVar40 = sVar37 + 4;
          do {
            sVar37 = uVar40 - 3;
            if (num_bytes <= uVar40) break;
            EvaluateNode(sVar28 + position,sVar37,sVar53,gap,dist_cache,self,&local_138,nodes);
            lVar25 = lVar25 + (ulong)*(uint *)((long)local_1f0 + uVar40 * 4 + -0xc);
            uVar40 = uVar40 + 1;
            lVar34 = lVar34 + -1;
          } while (lVar34 != 0);
        }
        uVar40 = sVar37 + 4;
        sVar37 = sVar37 + 1;
      } while (uVar40 < num_bytes);
    }
    sVar28 = ComputeShortestPathFromNodes(num_bytes,nodes);
    *num_commands = *num_commands + sVar28;
    BrotliZopfliCreateCommands
              (num_bytes,position,nodes,dist_cache,last_insert_len,params,commands,num_literals);
    bVar58 = !(bool)uVar13;
    uVar13 = false;
    lVar25 = lVar42;
    paVar14 = &nodes->u;
    if (bVar58) {
      BrotliFree(m,self->literal_costs_);
      self->literal_costs_ = (float *)0x0;
      BrotliFree(m,self->cost_dist_);
      self->cost_dist_ = (float *)0x0;
      BrotliFree(m,self);
      BrotliFree(m,nodes);
      BrotliFree(m,local_238);
      BrotliFree(m,local_1f0);
      return;
    }
  } while( true );
code_r0x002e82a7:
  uVar51 = uVar51 - 8;
  lVar47 = lVar47 + 8;
  if (uVar51 < 8) goto code_r0x002e82b5;
  goto LAB_002e829a;
code_r0x002e82b5:
  puVar46 = puVar43 + lVar47;
  puVar48 = puVar35 + lVar47;
LAB_002e82c1:
  if (uVar51 != 0) {
    uVar39 = 0;
    do {
      uVar31 = uVar39;
      if (puVar46[uVar39] != puVar48[uVar39]) break;
      uVar39 = uVar39 + 1;
      uVar31 = uVar51;
    } while (uVar51 != uVar39);
    puVar46 = puVar46 + uVar31;
  }
  uVar51 = (long)puVar46 - (long)puVar43;
LAB_002e8318:
  if (uVar41 < uVar51) {
    *(int *)total_found = (int)(uVar32 - uVar22);
    *(int *)(total_found + 4) = (int)uVar51 << 5;
    total_found = total_found + 8;
    uVar41 = uVar51;
  }
LAB_002e8339:
  uVar22 = uVar22 - 1;
  if ((uVar22 <= uVar44) || (2 < uVar41)) goto LAB_002e834b;
  goto LAB_002e824d;
code_r0x002e84ac:
  uVar54 = uVar54 - 8;
  lVar52 = lVar52 + 8;
  if (uVar54 < 8) goto code_r0x002e84ba;
  goto LAB_002e849f;
code_r0x002e84ba:
  puVar43 = puVar43 + lVar52;
  puVar46 = puVar35 + lVar52;
LAB_002e84d0:
  if (uVar54 != 0) {
    uVar36 = 0;
    do {
      uVar12 = uVar36;
      if (puVar46[uVar36] != puVar43[uVar36]) break;
      uVar36 = uVar36 + 1;
      uVar12 = uVar54;
    } while (uVar54 != uVar36);
    puVar46 = puVar46 + uVar12;
  }
  lVar52 = (long)puVar46 - (long)puVar35;
LAB_002e852c:
  uVar31 = lVar52 + uVar31;
  if (total_found == 0) {
    total_found = 0;
  }
  else if (uVar41 < uVar31) {
    *(int *)total_found = (int)(uVar32 - uVar51);
    *(int *)(total_found + 4) = (int)uVar31 << 5;
    total_found = total_found + 8;
    uVar41 = uVar31;
  }
  if (uVar44 <= uVar31) {
    if (uVar33 < 0x80) goto LAB_002e8616;
    *(undefined4 *)((long)pvVar21 + local_260 * 4) =
         *(undefined4 *)((long)pvVar21 + (uVar51 & uVar22) * 8);
    iVar18 = *(int *)((long)pvVar21 + (uVar51 & uVar22) * 8 + 4);
    goto LAB_002e83fd;
  }
  if (ringbuffer[uVar31 + (uVar51 & ringbuffer_mask)] < ringbuffer[uVar31 + uVar20]) {
    if (0x7f < uVar33) {
      *(int *)((long)pvVar21 + local_260 * 4) = (int)uVar51;
    }
    lVar52 = (uVar51 & uVar22) * 2 + 1;
    uVar39 = uVar31;
    local_260 = lVar52;
  }
  else {
    if (0x7f < uVar33) {
      *(int *)((long)pvVar21 + local_210 * 4) = (int)uVar51;
    }
    lVar52 = (uVar51 & uVar22) * 2;
    local_270 = uVar31;
    local_210 = lVar52;
  }
  uVar51 = (ulong)*(uint *)((long)pvVar21 + lVar52 * 4);
  if (uVar32 == uVar51) goto LAB_002e83d0;
  goto LAB_002e8447;
code_r0x002e8a07:
  puVar56 = puVar56 + 1;
  puVar30 = puVar30 + 1;
  lVar1 = uVar41 + lVar52;
  lVar52 = lVar52 + -8;
  if (lVar1 - 8U < 8) goto code_r0x002e8a21;
  goto LAB_002e89fb;
code_r0x002e8a21:
  uVar41 = uVar41 + lVar52;
  puVar29 = puVar30;
  if (uVar41 != 0) {
LAB_002e8a30:
    puVar30 = (ulong *)((long)puVar29 + uVar41);
    uVar51 = 0;
    do {
      if (*(uint8_t *)((long)puVar29 + uVar51) != *(uint8_t *)((long)puVar56 + uVar51)) {
        puVar30 = (ulong *)((long)puVar29 + uVar51);
        break;
      }
      uVar51 = uVar51 + 1;
    } while (uVar41 != uVar51);
  }
  uVar41 = (long)puVar30 - (long)puVar49;
LAB_002e8a64:
  if (uVar44 < uVar41) goto LAB_002e8a87;
LAB_002e8a7d:
  if (uVar17 != 0) goto LAB_002e8ad4;
  goto LAB_002e8960;
LAB_002e8a87:
  pBVar55->distance = (uint32_t)uVar39;
  pBVar55->length_and_code = (int)uVar41 << 5;
  pBVar55 = pBVar55 + 1;
  lVar47 = lVar47 + 1;
  uVar44 = uVar41;
  if (lVar47 == 0x40 - sVar37) goto LAB_002e8ad4;
  goto LAB_002e893b;
LAB_002e8ad4:
  sVar37 = sVar37 + lVar47;
  if (sVar37 != 0) {
    if (sVar37 == 0x40) goto LAB_002e8b1b;
    local_258 = (ulong)(*(uint *)((long)local_238 + sVar37 * 8 + lVar34 * 8 + -0x204) >> 5);
  }
  sVar53 = sVar53 + 1;
  if (sVar53 == sVar8) goto LAB_002e8b1b;
  goto LAB_002e8855;
LAB_002e8b1b:
  MergeMatches((BackwardMatch *)((long)local_238 + local_218 * 8),src1,sVar37,src2,sVar23);
  sVar23 = sVar23 + sVar37;
  auVar64 = _DAT_003b4370;
LAB_002e8b7e:
  *(int *)((long)local_1f0 + lVar25 * 4) = (int)sVar23;
  lVar34 = local_218;
  if (sVar23 != 0) {
    lVar34 = sVar23 + local_218;
    uVar17 = *(uint *)((long)local_238 + lVar34 * 8 + -4);
    if (0x28bf < uVar17) {
      uVar22 = (ulong)(uVar17 >> 5);
      uVar38 = uVar32 + 1;
      uVar50 = uVar32 + uVar22;
      if (lVar42 + position <= uVar50) {
        uVar50 = lVar42 + position;
      }
      uVar20 = uVar50 - 0x3f;
      if (uVar50 < uVar32 + 0x40) {
        uVar20 = uVar38;
      }
      *(undefined8 *)((long)local_238 + local_218 * 8) =
           *(undefined8 *)((long)local_238 + lVar34 * 8 + -8);
      *(undefined4 *)((long)local_1f0 + lVar25 * 4) = 1;
      if ((uVar32 + 0x201 <= uVar20) && (uVar38 < uVar20)) {
        uVar32 = (hasher->privat)._H5.bucket_size_;
        puVar7 = (hasher->privat)._H2.buckets_;
        pvVar21 = (hasher->privat)._H40.extra[1];
        do {
          uVar33 = uVar38 & ringbuffer_mask;
          uVar17 = (uint)(*(int *)(ringbuffer + uVar33) * 0x1e35a7bd) >> 0xf;
          uVar44 = (ulong)puVar7[uVar17];
          local_278 = (uVar32 & uVar38) * 2 + 1;
          local_270 = (uVar32 & uVar38) * 2;
          puVar7[uVar17] = (uint32_t)uVar38;
          if (uVar38 != uVar44) {
            lVar34 = 0x40;
            uVar41 = 0;
            uVar51 = 0;
LAB_002e8cc4:
            bVar58 = lVar34 != 0;
            lVar34 = lVar34 + -1;
            if ((uVar38 - uVar44 <= uVar32 - 0xf) && (bVar58)) {
              uVar39 = uVar51;
              if (uVar41 < uVar51) {
                uVar39 = uVar41;
              }
              puVar35 = ringbuffer + uVar39 + uVar33;
              puVar43 = ringbuffer + uVar39 + (uVar44 & ringbuffer_mask);
              uVar31 = 0x80 - uVar39;
              puVar46 = puVar35;
              if (7 < uVar31) {
                lVar47 = 0;
                lVar52 = 0;
LAB_002e8d13:
                if (*(ulong *)(puVar43 + lVar47) == *(ulong *)(puVar35 + lVar47))
                goto code_r0x002e8d20;
                uVar54 = *(ulong *)(puVar35 + lVar47) ^ *(ulong *)(puVar43 + lVar47);
                uVar31 = 0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                lVar52 = (uVar31 >> 3 & 0x1fffffff) - lVar52;
                goto LAB_002e8da5;
              }
              goto LAB_002e8d50;
            }
          }
LAB_002e8e07:
          iVar18 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)pvVar21 + local_270 * 4) = iVar18;
LAB_002e8e1b:
          *(int *)((long)pvVar21 + local_278 * 4) = iVar18;
          uVar38 = uVar38 + 8;
        } while (uVar38 < uVar20);
      }
      if (uVar20 < uVar50) {
        uVar32 = (hasher->privat)._H5.bucket_size_;
        puVar7 = (hasher->privat)._H2.buckets_;
        pvVar21 = (hasher->privat)._H40.extra[1];
        do {
          uVar38 = uVar20 & ringbuffer_mask;
          uVar17 = (uint)(*(int *)(ringbuffer + uVar38) * 0x1e35a7bd) >> 0xf;
          uVar33 = (ulong)puVar7[uVar17];
          local_270 = (uVar32 & uVar20) * 2 + 1;
          local_288 = (uVar32 & uVar20) * 2;
          puVar7[uVar17] = (uint32_t)uVar20;
          if (uVar20 != uVar33) {
            lVar34 = 0x40;
            uVar44 = 0;
            uVar41 = 0;
LAB_002e8f10:
            bVar58 = lVar34 != 0;
            lVar34 = lVar34 + -1;
            if ((uVar20 - uVar33 <= uVar32 - 0xf) && (bVar58)) {
              uVar51 = uVar44;
              if (uVar41 < uVar44) {
                uVar51 = uVar41;
              }
              puVar46 = ringbuffer + uVar51 + uVar38;
              puVar35 = ringbuffer + uVar51 + (uVar33 & ringbuffer_mask);
              uVar39 = 0x80 - uVar51;
              puVar43 = puVar46;
              if (7 < uVar39) {
                lVar47 = 0;
                lVar52 = 0;
LAB_002e8f6a:
                if (*(ulong *)(puVar35 + lVar47) == *(ulong *)(puVar46 + lVar47))
                goto code_r0x002e8f77;
                uVar31 = *(ulong *)(puVar46 + lVar47) ^ *(ulong *)(puVar35 + lVar47);
                uVar39 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                lVar52 = (uVar39 >> 3 & 0x1fffffff) - lVar52;
                goto LAB_002e8ff4;
              }
              goto LAB_002e8fa8;
            }
          }
LAB_002e9057:
          iVar18 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)pvVar21 + local_288 * 4) = iVar18;
LAB_002e906b:
          *(int *)((long)pvVar21 + local_270 * 4) = iVar18;
          uVar20 = uVar20 + 1;
        } while (uVar20 < uVar50);
      }
      lVar34 = uVar22 - 1;
      memset((void *)((long)local_1f0 + lVar25 * 4 + 4),0,lVar34 * 4);
      lVar25 = lVar25 + lVar34;
      auVar64 = _DAT_003b4370;
      lVar34 = local_218 + 1;
    }
  }
  local_218 = lVar34;
  uVar32 = lVar25 + 4;
  lVar25 = lVar25 + 1;
  if (num_bytes <= uVar32) goto LAB_002e91d1;
  goto LAB_002e802d;
code_r0x002e8d20:
  lVar47 = lVar47 + 8;
  lVar1 = uVar31 + lVar52;
  lVar52 = lVar52 + -8;
  if (lVar1 - 8U < 8) goto code_r0x002e8d36;
  goto LAB_002e8d13;
code_r0x002e8d36:
  puVar43 = puVar43 + -lVar52;
  uVar31 = uVar31 + lVar52;
  puVar46 = puVar35 + -lVar52;
LAB_002e8d50:
  if (uVar31 != 0) {
    uVar54 = 0;
    do {
      uVar36 = uVar54;
      if (puVar46[uVar54] != puVar43[uVar54]) break;
      uVar54 = uVar54 + 1;
      uVar36 = uVar31;
    } while (uVar31 != uVar54);
    puVar46 = puVar46 + uVar36;
  }
  lVar52 = (long)puVar46 - (long)puVar35;
LAB_002e8da5:
  uVar39 = lVar52 + uVar39;
  if (0x7f < uVar39) {
    *(undefined4 *)((long)pvVar21 + local_270 * 4) =
         *(undefined4 *)((long)pvVar21 + (uVar44 & uVar32) * 8);
    iVar18 = *(int *)((long)pvVar21 + (uVar44 & uVar32) * 8 + 4);
    goto LAB_002e8e1b;
  }
  uVar31 = (uVar44 & uVar32) * 2;
  if (ringbuffer[uVar39 + (uVar44 & ringbuffer_mask)] < ringbuffer[uVar39 + uVar33]) {
    *(int *)((long)pvVar21 + local_270 * 4) = (int)uVar44;
    uVar31 = uVar31 | 1;
    uVar41 = uVar39;
    uVar39 = uVar51;
    local_270 = uVar31;
  }
  else {
    *(int *)((long)pvVar21 + local_278 * 4) = (int)uVar44;
    local_278 = uVar31;
  }
  uVar44 = (ulong)*(uint *)((long)pvVar21 + uVar31 * 4);
  uVar51 = uVar39;
  if (uVar38 == uVar44) goto LAB_002e8e07;
  goto LAB_002e8cc4;
code_r0x002e8f77:
  lVar47 = lVar47 + 8;
  lVar1 = uVar39 + lVar52;
  lVar52 = lVar52 + -8;
  if (lVar1 - 8U < 8) goto code_r0x002e8f8d;
  goto LAB_002e8f6a;
code_r0x002e8f8d:
  puVar35 = puVar35 + -lVar52;
  uVar39 = uVar39 + lVar52;
  puVar43 = puVar46 + -lVar52;
LAB_002e8fa8:
  if (uVar39 != 0) {
    uVar31 = 0;
    do {
      uVar54 = uVar31;
      if (puVar43[uVar31] != puVar35[uVar31]) break;
      uVar31 = uVar31 + 1;
      uVar54 = uVar39;
    } while (uVar39 != uVar31);
    puVar43 = puVar43 + uVar54;
  }
  lVar52 = (long)puVar43 - (long)puVar46;
LAB_002e8ff4:
  uVar51 = lVar52 + uVar51;
  if (0x7f < uVar51) {
    *(undefined4 *)((long)pvVar21 + local_288 * 4) =
         *(undefined4 *)((long)pvVar21 + (uVar33 & uVar32) * 8);
    iVar18 = *(int *)((long)pvVar21 + (uVar33 & uVar32) * 8 + 4);
    goto LAB_002e906b;
  }
  uVar39 = (uVar33 & uVar32) * 2;
  if (ringbuffer[uVar51 + (uVar33 & ringbuffer_mask)] < ringbuffer[uVar51 + uVar38]) {
    *(int *)((long)pvVar21 + local_288 * 4) = (int)uVar33;
    uVar39 = uVar39 | 1;
    uVar41 = uVar51;
    local_288 = uVar39;
  }
  else {
    *(int *)((long)pvVar21 + local_270 * 4) = (int)uVar33;
    uVar44 = uVar51;
    local_270 = uVar39;
  }
  uVar33 = (ulong)*(uint *)((long)pvVar21 + uVar39 * 4);
  if (uVar20 == uVar33) goto LAB_002e9057;
  goto LAB_002e8f10;
}

Assistant:

void duckdb_brotli::BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t shadow_matches =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) ||
      BROTLI_IS_NULL(num_matches) || BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, max_length,
          dictionary_start, params->dist.max_distance,
          &matches[cur_match_pos + shadow_matches - 64], 64);
      MergeMatches(&matches[cur_match_pos],
          &matches[cur_match_pos + shadow_matches - 64], cd_matches,
          &matches[cur_match_pos + shadow_matches], num_found_matches);
      num_found_matches += cd_matches;
    }
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}